

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

int __thiscall
ApprovalTests::Options::clone
          (Options *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  code usingDefaultScrubber;
  Reporter *reporter;
  __shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2> local_80;
  undefined1 local_70 [40];
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_48;
  
  FileOptions::FileOptions((FileOptions *)local_70,(FileOptions *)__child_stack);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_48,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)(__fn + 0x28));
  reporter = *(Reporter **)(__fn + 0x48);
  usingDefaultScrubber = __fn[0x60];
  ::std::__shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,
             (__shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2> *)(__fn + 0x50)
            );
  Options(this,(FileOptions *)local_70,&local_48,reporter,(bool)usingDefaultScrubber,
          (shared_ptr<ApprovalTests::ApprovalNamer> *)&local_80);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  ::std::_Function_base::~_Function_base(&local_48.super__Function_base);
  ::std::__cxx11::string::~string((string *)(local_70 + 8));
  return (int)this;
}

Assistant:

Options Options::clone(const Options::FileOptions& fileOptions) const
    {
        // TODO error this can retain a previous Options* ???
        return Options(fileOptions, scrubber_, reporter_, usingDefaultScrubber_, namer_);
    }